

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucmndata.cpp
# Opt level: O0

int32_t offsetTOCPrefixBinarySearch(char *s,char *names,UDataOffsetTOCEntry *toc,int32_t count)

{
  int32_t iVar1;
  int32_t local_4c;
  int32_t local_44;
  int32_t cmp;
  int32_t prefixLength;
  int32_t i;
  int32_t limitPrefixLength;
  int32_t startPrefixLength;
  int32_t limit;
  int32_t start;
  int32_t count_local;
  UDataOffsetTOCEntry *toc_local;
  char *names_local;
  char *s_local;
  
  startPrefixLength = 0;
  i = 0;
  prefixLength = 0;
  if (count == 0) {
    s_local._4_4_ = -1;
  }
  else {
    limitPrefixLength = count;
    limit = count;
    _start = toc;
    toc_local = (UDataOffsetTOCEntry *)names;
    names_local = s;
    iVar1 = strcmpAfterPrefix(s,names + toc->nameOffset,&i);
    if (iVar1 == 0) {
      s_local._4_4_ = 0;
    }
    else {
      startPrefixLength = startPrefixLength + 1;
      limitPrefixLength = limitPrefixLength + -1;
      iVar1 = strcmpAfterPrefix(names_local,
                                (char *)((long)&toc_local->nameOffset +
                                        (ulong)_start[limitPrefixLength].nameOffset),&prefixLength);
      if (iVar1 == 0) {
        s_local._4_4_ = limitPrefixLength;
      }
      else {
        while (startPrefixLength < limitPrefixLength) {
          cmp = (startPrefixLength + limitPrefixLength) / 2;
          if (i < prefixLength) {
            local_4c = i;
          }
          else {
            local_4c = prefixLength;
          }
          local_44 = local_4c;
          iVar1 = strcmpAfterPrefix(names_local,
                                    (char *)((long)&toc_local->nameOffset +
                                            (ulong)_start[cmp].nameOffset),&local_44);
          if (iVar1 < 0) {
            limitPrefixLength = cmp;
            prefixLength = local_44;
          }
          else {
            if (iVar1 == 0) {
              return cmp;
            }
            startPrefixLength = cmp + 1;
            i = local_44;
          }
        }
        s_local._4_4_ = -1;
      }
    }
  }
  return s_local._4_4_;
}

Assistant:

static int32_t
offsetTOCPrefixBinarySearch(const char *s, const char *names,
                            const UDataOffsetTOCEntry *toc, int32_t count) {
    int32_t start=0;
    int32_t limit=count;
    /*
     * Remember the shared prefix between s, start and limit,
     * and don't compare that shared prefix again.
     * The shared prefix should get longer as we narrow the [start, limit[ range.
     */
    int32_t startPrefixLength=0;
    int32_t limitPrefixLength=0;
    if(count==0) {
        return -1;
    }
    /*
     * Prime the prefix lengths so that we don't keep prefixLength at 0 until
     * both the start and limit indexes have moved.
     * At the same time, we find if s is one of the start and (limit-1) names,
     * and if not, exclude them from the actual binary search.
     */
    if(0==strcmpAfterPrefix(s, names+toc[0].nameOffset, &startPrefixLength)) {
        return 0;
    }
    ++start;
    --limit;
    if(0==strcmpAfterPrefix(s, names+toc[limit].nameOffset, &limitPrefixLength)) {
        return limit;
    }
    while(start<limit) {
        int32_t i=(start+limit)/2;
        int32_t prefixLength=MIN(startPrefixLength, limitPrefixLength);
        int32_t cmp=strcmpAfterPrefix(s, names+toc[i].nameOffset, &prefixLength);
        if(cmp<0) {
            limit=i;
            limitPrefixLength=prefixLength;
        } else if(cmp==0) {
            return i;
        } else {
            start=i+1;
            startPrefixLength=prefixLength;
        }
    }
    return -1;
}